

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
BitsEqualFailure::BitsEqualFailure
          (BitsEqualFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          unsigned_long expected,unsigned_long actual,unsigned_long mask,size_t byteCount,
          SimpleString *text)

{
  SimpleString *in_RDI;
  unsigned_long in_R8;
  TestFailure *in_R9;
  SimpleString *in_stack_ffffffffffffff80;
  SimpleString *in_stack_ffffffffffffff88;
  SimpleString *in_stack_ffffffffffffff90;
  TestFailure *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffb8;
  SimpleString *in_stack_ffffffffffffffc0;
  TestFailure *in_stack_ffffffffffffffc8;
  
  TestFailure::TestFailure
            (in_R9,(UtestShell *)in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8);
  in_RDI->buffer_ = (char *)&PTR__BitsEqualFailure_001c3d58;
  TestFailure::createUserText(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  SimpleString::operator=(in_stack_ffffffffffffff80,in_RDI);
  SimpleString::~SimpleString((SimpleString *)0x17c2d0);
  StringFromMaskedBits(in_R8,(unsigned_long)in_R9,(size_t)in_stack_ffffffffffffffc8);
  StringFromMaskedBits(in_R8,(unsigned_long)in_R9,(size_t)in_stack_ffffffffffffffc8);
  TestFailure::createButWasString
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  SimpleString::operator+=(in_stack_ffffffffffffff80,in_RDI);
  SimpleString::~SimpleString((SimpleString *)0x17c34a);
  SimpleString::~SimpleString((SimpleString *)0x17c354);
  SimpleString::~SimpleString((SimpleString *)0x17c35e);
  return;
}

Assistant:

BitsEqualFailure::BitsEqualFailure(UtestShell* test, const char* fileName, size_t lineNumber, unsigned long expected, unsigned long actual,
                                   unsigned long mask, size_t byteCount, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    message_ += createButWasString(StringFromMaskedBits(expected, mask, byteCount), StringFromMaskedBits(actual, mask, byteCount));
}